

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::VarintCasesWithSizes_WriteVarint64_Test::
VarintCasesWithSizes_WriteVarint64_Test(VarintCasesWithSizes_WriteVarint64_Test *this)

{
  VarintCasesWithSizes_WriteVarint64_Test *this_local;
  
  VarintCasesWithSizes::VarintCasesWithSizes(&this->super_VarintCasesWithSizes);
  (this->super_VarintCasesWithSizes).super_CodedStreamTest.super_Test._vptr_Test =
       (_func_int **)&PTR__VarintCasesWithSizes_WriteVarint64_Test_02a14440;
  (this->super_VarintCasesWithSizes).
  super_WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&DAT_02a14480;
  return;
}

Assistant:

TEST_P(VarintCasesWithSizes, WriteVarint64) {
  const VarintCase& kVarintCases_case = std::get<0>(GetParam());
  const int& kBlockSizes_case = std::get<1>(GetParam());
  ArrayOutputStream output(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedOutputStream coded_output(&output);

    coded_output.WriteVarint64(kVarintCases_case.value);
    EXPECT_FALSE(coded_output.HadError());

    EXPECT_EQ(kVarintCases_case.size, coded_output.ByteCount());
  }

  EXPECT_EQ(kVarintCases_case.size, output.ByteCount());
  EXPECT_EQ(0,
            memcmp(buffer_, kVarintCases_case.bytes, kVarintCases_case.size));
}